

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O1

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)4>(void)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  AlignedVector<int> output;
  AlignedVector<signed_char> input;
  AssertionHandler catchAssertionHandler;
  int local_2ac;
  AlignedVector<int> local_2a8;
  AlignedVector<signed_char> local_298;
  undefined1 local_288 [64];
  SourceLineInfo local_248;
  undefined1 local_238 [64];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [64];
  ITransientExpression local_178;
  undefined1 *local_168;
  char *local_160;
  size_t sStack_158;
  int *local_150;
  StringRef local_148;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  AssertionHandler local_78;
  
  if (3 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_298,0x40,0x40);
    AlignedVector<int>::AlignedVector(&local_2a8,0x40,0x40);
    if (local_298.size_ != 0) {
      auVar9 = vpbroadcastq_avx512f();
      auVar10 = vmovdqa64_avx512f(_DAT_001bbfc0);
      uVar7 = 0;
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar19 = vpbroadcastb_avx512bw(ZEXT116(0x40));
      do {
        auVar20 = vpbroadcastq_avx512f();
        auVar21 = vporq_avx512f(auVar20,auVar11);
        auVar22 = vporq_avx512f(auVar20,auVar12);
        auVar23 = vporq_avx512f(auVar20,auVar13);
        auVar24 = vporq_avx512f(auVar20,auVar14);
        auVar25 = vporq_avx512f(auVar20,auVar15);
        auVar26 = vporq_avx512f(auVar20,auVar16);
        auVar27 = vporq_avx512f(auVar20,auVar17);
        auVar20 = vporq_avx512f(auVar20,auVar18);
        vpcmpuq_avx512f(auVar20,auVar9,2);
        vpcmpuq_avx512f(auVar27,auVar9,2);
        vpcmpuq_avx512f(auVar26,auVar9,2);
        vpcmpuq_avx512f(auVar25,auVar9,2);
        vpcmpuq_avx512f(auVar24,auVar9,2);
        vpcmpuq_avx512f(auVar23,auVar9,2);
        vpcmpuq_avx512f(auVar22,auVar9,2);
        vpcmpuq_avx512f(auVar21,auVar9,2);
        auVar20 = vmovdqu8_avx512bw(auVar10);
        *(undefined1 (*) [64])(local_298.mem_ + uVar7) = auVar20;
        uVar7 = uVar7 + 0x40;
        auVar10 = vpaddb_avx512bw(auVar10,auVar19);
      } while ((local_298.size_ + 0x3f & 0xffffffffffffffc0) != uVar7);
    }
    auVar9 = vmovdqa64_avx512f(*(undefined1 (*) [64])local_298.mem_);
    if (kernels::upcast8to16(long_long(int))::vzero == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    if (kernels::upcast8to16(long_long(int))::vmax_negative == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    if (kernels::upcast8to16(long_long(int))::permutation_indices == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    auVar10 = vmovdqa64_avx512f(kernels::upcast8to16(long_long(int))::permutation_indices);
    auVar12 = vmovdqa64_avx512f(kernels::upcast8to16(long_long(int))::vzero);
    auVar11 = vmovdqa64_avx512f(kernels::upcast8to16(long_long(int))::vmax_negative);
    if (kernels::upcast16to32(long_long(int))::vzero == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      local_238 = vmovdqu64_avx512f(auVar12);
      local_1b8 = vmovdqu64_avx512f(auVar11);
      local_1f8 = vmovdqu64_avx512f(auVar10);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar10 = vmovdqu64_avx512f(local_1f8);
      auVar11 = vmovdqu64_avx512f(local_1b8);
      auVar12 = vmovdqu64_avx512f(local_238);
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    if (kernels::upcast16to32(long_long(int))::vmax_negative == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      local_238 = vmovdqu64_avx512f(auVar12);
      local_1b8 = vmovdqu64_avx512f(auVar11);
      local_1f8 = vmovdqu64_avx512f(auVar10);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar10 = vmovdqu64_avx512f(local_1f8);
      auVar11 = vmovdqu64_avx512f(local_1b8);
      auVar12 = vmovdqu64_avx512f(local_238);
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    if (kernels::upcast16to32(long_long(int))::permutation_indices == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      local_238 = vmovdqu64_avx512f(auVar12);
      local_1b8 = vmovdqu64_avx512f(auVar11);
      local_1f8 = vmovdqu64_avx512f(auVar10);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar10 = vmovdqu64_avx512f(local_1f8);
      auVar11 = vmovdqu64_avx512f(local_1b8);
      auVar12 = vmovdqu64_avx512f(local_238);
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    auVar13 = vmovdqa64_avx512f(kernels::upcast16to32(long_long(int))::permutation_indices);
    auVar15 = vmovdqa64_avx512f(kernels::upcast16to32(long_long(int))::vzero);
    auVar14 = vmovdqa64_avx512f(kernels::upcast16to32(long_long(int))::vmax_negative);
    if (kernels::upcast16to32(long_long(int))::vzero == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      local_238 = vmovdqu64_avx512f(auVar12);
      local_1b8 = vmovdqu64_avx512f(auVar11);
      local_1f8 = vmovdqu64_avx512f(auVar10);
      local_b8 = vmovdqu64_avx512f(auVar15);
      local_f8 = vmovdqu64_avx512f(auVar14);
      local_138 = vmovdqu64_avx512f(auVar13);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar13 = vmovdqu64_avx512f(local_138);
      auVar14 = vmovdqu64_avx512f(local_f8);
      auVar15 = vmovdqu64_avx512f(local_b8);
      auVar10 = vmovdqu64_avx512f(local_1f8);
      auVar11 = vmovdqu64_avx512f(local_1b8);
      auVar12 = vmovdqu64_avx512f(local_238);
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    if (kernels::upcast16to32(long_long(int))::vmax_negative == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      local_238 = vmovdqu64_avx512f(auVar12);
      local_1b8 = vmovdqu64_avx512f(auVar11);
      local_1f8 = vmovdqu64_avx512f(auVar10);
      local_b8 = vmovdqu64_avx512f(auVar15);
      local_f8 = vmovdqu64_avx512f(auVar14);
      local_138 = vmovdqu64_avx512f(auVar13);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar13 = vmovdqu64_avx512f(local_138);
      auVar14 = vmovdqu64_avx512f(local_f8);
      auVar15 = vmovdqu64_avx512f(local_b8);
      auVar10 = vmovdqu64_avx512f(local_1f8);
      auVar11 = vmovdqu64_avx512f(local_1b8);
      auVar12 = vmovdqu64_avx512f(local_238);
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    if (kernels::upcast16to32(long_long(int))::permutation_indices == '\0') {
      local_288 = vmovdqu64_avx512f(auVar9);
      local_238 = vmovdqu64_avx512f(auVar12);
      local_1b8 = vmovdqu64_avx512f(auVar11);
      local_1f8 = vmovdqu64_avx512f(auVar10);
      local_b8 = vmovdqu64_avx512f(auVar15);
      local_f8 = vmovdqu64_avx512f(auVar14);
      local_138 = vmovdqu64_avx512f(auVar13);
      kernel_upcast8to32_test<(intgemm::CPUType)4>();
      auVar13 = vmovdqu64_avx512f(local_138);
      auVar14 = vmovdqu64_avx512f(local_f8);
      auVar15 = vmovdqu64_avx512f(local_b8);
      auVar10 = vmovdqu64_avx512f(local_1f8);
      auVar11 = vmovdqu64_avx512f(local_1b8);
      auVar12 = vmovdqu64_avx512f(local_238);
      auVar9 = vmovdqu64_avx512f(local_288);
    }
    auVar9 = vpermq_avx512f(auVar10,auVar9);
    uVar7 = vpcmpgtb_avx512bw(auVar12,auVar9);
    auVar10 = vmovdqu8_avx512bw(auVar11);
    bVar3 = (bool)((byte)uVar7 & 1);
    auVar11[0] = bVar3 * auVar10[0] | !bVar3 * auVar12[0];
    bVar3 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar11[1] = bVar3 * auVar10[1] | !bVar3 * auVar12[1];
    bVar3 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar11[2] = bVar3 * auVar10[2] | !bVar3 * auVar12[2];
    bVar3 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar11[3] = bVar3 * auVar10[3] | !bVar3 * auVar12[3];
    bVar3 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar11[4] = bVar3 * auVar10[4] | !bVar3 * auVar12[4];
    bVar3 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar11[5] = bVar3 * auVar10[5] | !bVar3 * auVar12[5];
    bVar3 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar11[6] = bVar3 * auVar10[6] | !bVar3 * auVar12[6];
    bVar3 = (bool)((byte)(uVar7 >> 7) & 1);
    auVar11[7] = bVar3 * auVar10[7] | !bVar3 * auVar12[7];
    bVar3 = (bool)((byte)(uVar7 >> 8) & 1);
    auVar11[8] = bVar3 * auVar10[8] | !bVar3 * auVar12[8];
    bVar3 = (bool)((byte)(uVar7 >> 9) & 1);
    auVar11[9] = bVar3 * auVar10[9] | !bVar3 * auVar12[9];
    bVar3 = (bool)((byte)(uVar7 >> 10) & 1);
    auVar11[10] = bVar3 * auVar10[10] | !bVar3 * auVar12[10];
    bVar3 = (bool)((byte)(uVar7 >> 0xb) & 1);
    auVar11[0xb] = bVar3 * auVar10[0xb] | !bVar3 * auVar12[0xb];
    bVar3 = (bool)((byte)(uVar7 >> 0xc) & 1);
    auVar11[0xc] = bVar3 * auVar10[0xc] | !bVar3 * auVar12[0xc];
    bVar3 = (bool)((byte)(uVar7 >> 0xd) & 1);
    auVar11[0xd] = bVar3 * auVar10[0xd] | !bVar3 * auVar12[0xd];
    bVar3 = (bool)((byte)(uVar7 >> 0xe) & 1);
    auVar11[0xe] = bVar3 * auVar10[0xe] | !bVar3 * auVar12[0xe];
    bVar3 = (bool)((byte)(uVar7 >> 0xf) & 1);
    auVar11[0xf] = bVar3 * auVar10[0xf] | !bVar3 * auVar12[0xf];
    bVar3 = (bool)((byte)(uVar7 >> 0x10) & 1);
    auVar11[0x10] = bVar3 * auVar10[0x10] | !bVar3 * auVar12[0x10];
    bVar3 = (bool)((byte)(uVar7 >> 0x11) & 1);
    auVar11[0x11] = bVar3 * auVar10[0x11] | !bVar3 * auVar12[0x11];
    bVar3 = (bool)((byte)(uVar7 >> 0x12) & 1);
    auVar11[0x12] = bVar3 * auVar10[0x12] | !bVar3 * auVar12[0x12];
    bVar3 = (bool)((byte)(uVar7 >> 0x13) & 1);
    auVar11[0x13] = bVar3 * auVar10[0x13] | !bVar3 * auVar12[0x13];
    bVar3 = (bool)((byte)(uVar7 >> 0x14) & 1);
    auVar11[0x14] = bVar3 * auVar10[0x14] | !bVar3 * auVar12[0x14];
    bVar3 = (bool)((byte)(uVar7 >> 0x15) & 1);
    auVar11[0x15] = bVar3 * auVar10[0x15] | !bVar3 * auVar12[0x15];
    bVar3 = (bool)((byte)(uVar7 >> 0x16) & 1);
    auVar11[0x16] = bVar3 * auVar10[0x16] | !bVar3 * auVar12[0x16];
    bVar3 = (bool)((byte)(uVar7 >> 0x17) & 1);
    auVar11[0x17] = bVar3 * auVar10[0x17] | !bVar3 * auVar12[0x17];
    bVar3 = (bool)((byte)(uVar7 >> 0x18) & 1);
    auVar11[0x18] = bVar3 * auVar10[0x18] | !bVar3 * auVar12[0x18];
    bVar3 = (bool)((byte)(uVar7 >> 0x19) & 1);
    auVar11[0x19] = bVar3 * auVar10[0x19] | !bVar3 * auVar12[0x19];
    bVar3 = (bool)((byte)(uVar7 >> 0x1a) & 1);
    auVar11[0x1a] = bVar3 * auVar10[0x1a] | !bVar3 * auVar12[0x1a];
    bVar3 = (bool)((byte)(uVar7 >> 0x1b) & 1);
    auVar11[0x1b] = bVar3 * auVar10[0x1b] | !bVar3 * auVar12[0x1b];
    bVar3 = (bool)((byte)(uVar7 >> 0x1c) & 1);
    auVar11[0x1c] = bVar3 * auVar10[0x1c] | !bVar3 * auVar12[0x1c];
    bVar3 = (bool)((byte)(uVar7 >> 0x1d) & 1);
    auVar11[0x1d] = bVar3 * auVar10[0x1d] | !bVar3 * auVar12[0x1d];
    bVar3 = (bool)((byte)(uVar7 >> 0x1e) & 1);
    auVar11[0x1e] = bVar3 * auVar10[0x1e] | !bVar3 * auVar12[0x1e];
    bVar3 = (bool)((byte)(uVar7 >> 0x1f) & 1);
    auVar11[0x1f] = bVar3 * auVar10[0x1f] | !bVar3 * auVar12[0x1f];
    bVar3 = (bool)((byte)(uVar7 >> 0x20) & 1);
    auVar11[0x20] = bVar3 * auVar10[0x20] | !bVar3 * auVar12[0x20];
    bVar3 = (bool)((byte)(uVar7 >> 0x21) & 1);
    auVar11[0x21] = bVar3 * auVar10[0x21] | !bVar3 * auVar12[0x21];
    bVar3 = (bool)((byte)(uVar7 >> 0x22) & 1);
    auVar11[0x22] = bVar3 * auVar10[0x22] | !bVar3 * auVar12[0x22];
    bVar3 = (bool)((byte)(uVar7 >> 0x23) & 1);
    auVar11[0x23] = bVar3 * auVar10[0x23] | !bVar3 * auVar12[0x23];
    bVar3 = (bool)((byte)(uVar7 >> 0x24) & 1);
    auVar11[0x24] = bVar3 * auVar10[0x24] | !bVar3 * auVar12[0x24];
    bVar3 = (bool)((byte)(uVar7 >> 0x25) & 1);
    auVar11[0x25] = bVar3 * auVar10[0x25] | !bVar3 * auVar12[0x25];
    bVar3 = (bool)((byte)(uVar7 >> 0x26) & 1);
    auVar11[0x26] = bVar3 * auVar10[0x26] | !bVar3 * auVar12[0x26];
    bVar3 = (bool)((byte)(uVar7 >> 0x27) & 1);
    auVar11[0x27] = bVar3 * auVar10[0x27] | !bVar3 * auVar12[0x27];
    bVar3 = (bool)((byte)(uVar7 >> 0x28) & 1);
    auVar11[0x28] = bVar3 * auVar10[0x28] | !bVar3 * auVar12[0x28];
    bVar3 = (bool)((byte)(uVar7 >> 0x29) & 1);
    auVar11[0x29] = bVar3 * auVar10[0x29] | !bVar3 * auVar12[0x29];
    bVar3 = (bool)((byte)(uVar7 >> 0x2a) & 1);
    auVar11[0x2a] = bVar3 * auVar10[0x2a] | !bVar3 * auVar12[0x2a];
    bVar3 = (bool)((byte)(uVar7 >> 0x2b) & 1);
    auVar11[0x2b] = bVar3 * auVar10[0x2b] | !bVar3 * auVar12[0x2b];
    bVar3 = (bool)((byte)(uVar7 >> 0x2c) & 1);
    auVar11[0x2c] = bVar3 * auVar10[0x2c] | !bVar3 * auVar12[0x2c];
    bVar3 = (bool)((byte)(uVar7 >> 0x2d) & 1);
    auVar11[0x2d] = bVar3 * auVar10[0x2d] | !bVar3 * auVar12[0x2d];
    bVar3 = (bool)((byte)(uVar7 >> 0x2e) & 1);
    auVar11[0x2e] = bVar3 * auVar10[0x2e] | !bVar3 * auVar12[0x2e];
    bVar3 = (bool)((byte)(uVar7 >> 0x2f) & 1);
    auVar11[0x2f] = bVar3 * auVar10[0x2f] | !bVar3 * auVar12[0x2f];
    bVar3 = (bool)((byte)(uVar7 >> 0x30) & 1);
    auVar11[0x30] = bVar3 * auVar10[0x30] | !bVar3 * auVar12[0x30];
    bVar3 = (bool)((byte)(uVar7 >> 0x31) & 1);
    auVar11[0x31] = bVar3 * auVar10[0x31] | !bVar3 * auVar12[0x31];
    bVar3 = (bool)((byte)(uVar7 >> 0x32) & 1);
    auVar11[0x32] = bVar3 * auVar10[0x32] | !bVar3 * auVar12[0x32];
    bVar3 = (bool)((byte)(uVar7 >> 0x33) & 1);
    auVar11[0x33] = bVar3 * auVar10[0x33] | !bVar3 * auVar12[0x33];
    bVar3 = (bool)((byte)(uVar7 >> 0x34) & 1);
    auVar11[0x34] = bVar3 * auVar10[0x34] | !bVar3 * auVar12[0x34];
    bVar3 = (bool)((byte)(uVar7 >> 0x35) & 1);
    auVar11[0x35] = bVar3 * auVar10[0x35] | !bVar3 * auVar12[0x35];
    bVar3 = (bool)((byte)(uVar7 >> 0x36) & 1);
    auVar11[0x36] = bVar3 * auVar10[0x36] | !bVar3 * auVar12[0x36];
    bVar3 = (bool)((byte)(uVar7 >> 0x37) & 1);
    auVar11[0x37] = bVar3 * auVar10[0x37] | !bVar3 * auVar12[0x37];
    bVar4 = (byte)(uVar7 >> 0x38);
    auVar11[0x38] = (bVar4 & 1) * auVar10[0x38] | !(bool)(bVar4 & 1) * auVar12[0x38];
    bVar3 = (bool)(bVar4 >> 1 & 1);
    auVar11[0x39] = bVar3 * auVar10[0x39] | !bVar3 * auVar12[0x39];
    bVar3 = (bool)(bVar4 >> 2 & 1);
    auVar11[0x3a] = bVar3 * auVar10[0x3a] | !bVar3 * auVar12[0x3a];
    bVar3 = (bool)(bVar4 >> 3 & 1);
    auVar11[0x3b] = bVar3 * auVar10[0x3b] | !bVar3 * auVar12[0x3b];
    bVar3 = (bool)(bVar4 >> 4 & 1);
    auVar11[0x3c] = bVar3 * auVar10[0x3c] | !bVar3 * auVar12[0x3c];
    bVar3 = (bool)(bVar4 >> 5 & 1);
    auVar11[0x3d] = bVar3 * auVar10[0x3d] | !bVar3 * auVar12[0x3d];
    bVar3 = (bool)(bVar4 >> 6 & 1);
    auVar11[0x3e] = bVar3 * auVar10[0x3e] | !bVar3 * auVar12[0x3e];
    auVar11[0x3f] = -((char)bVar4 >> 7) * auVar10[0x3f] | !(bool)-((char)bVar4 >> 7) * auVar12[0x3f]
    ;
    auVar10 = vpunpckhbw_avx512bw(auVar9,auVar11);
    auVar9 = vpunpcklbw_avx512bw(auVar9,auVar11);
    auVar9 = vpermq_avx512f(auVar13,auVar9);
    uVar7 = vpcmpgtw_avx512bw(auVar15,auVar9);
    auVar11 = vmovdqu16_avx512bw(auVar14);
    bVar3 = (bool)((byte)uVar7 & 1);
    auVar12._0_2_ = (ushort)bVar3 * auVar11._0_2_ | (ushort)!bVar3 * auVar15._0_2_;
    bVar3 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar12._2_2_ = (ushort)bVar3 * auVar11._2_2_ | (ushort)!bVar3 * auVar15._2_2_;
    bVar3 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar12._4_2_ = (ushort)bVar3 * auVar11._4_2_ | (ushort)!bVar3 * auVar15._4_2_;
    bVar3 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar12._6_2_ = (ushort)bVar3 * auVar11._6_2_ | (ushort)!bVar3 * auVar15._6_2_;
    bVar3 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar12._8_2_ = (ushort)bVar3 * auVar11._8_2_ | (ushort)!bVar3 * auVar15._8_2_;
    bVar3 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar12._10_2_ = (ushort)bVar3 * auVar11._10_2_ | (ushort)!bVar3 * auVar15._10_2_;
    bVar3 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar12._12_2_ = (ushort)bVar3 * auVar11._12_2_ | (ushort)!bVar3 * auVar15._12_2_;
    bVar3 = (bool)((byte)(uVar7 >> 7) & 1);
    auVar12._14_2_ = (ushort)bVar3 * auVar11._14_2_ | (ushort)!bVar3 * auVar15._14_2_;
    bVar3 = (bool)((byte)(uVar7 >> 8) & 1);
    auVar12._16_2_ = (ushort)bVar3 * auVar11._16_2_ | (ushort)!bVar3 * auVar15._16_2_;
    bVar3 = (bool)((byte)(uVar7 >> 9) & 1);
    auVar12._18_2_ = (ushort)bVar3 * auVar11._18_2_ | (ushort)!bVar3 * auVar15._18_2_;
    bVar3 = (bool)((byte)(uVar7 >> 10) & 1);
    auVar12._20_2_ = (ushort)bVar3 * auVar11._20_2_ | (ushort)!bVar3 * auVar15._20_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xb) & 1);
    auVar12._22_2_ = (ushort)bVar3 * auVar11._22_2_ | (ushort)!bVar3 * auVar15._22_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xc) & 1);
    auVar12._24_2_ = (ushort)bVar3 * auVar11._24_2_ | (ushort)!bVar3 * auVar15._24_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xd) & 1);
    auVar12._26_2_ = (ushort)bVar3 * auVar11._26_2_ | (ushort)!bVar3 * auVar15._26_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xe) & 1);
    auVar12._28_2_ = (ushort)bVar3 * auVar11._28_2_ | (ushort)!bVar3 * auVar15._28_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xf) & 1);
    auVar12._30_2_ = (ushort)bVar3 * auVar11._30_2_ | (ushort)!bVar3 * auVar15._30_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x10) & 1);
    auVar12._32_2_ = (ushort)bVar3 * auVar11._32_2_ | (ushort)!bVar3 * auVar15._32_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x11) & 1);
    auVar12._34_2_ = (ushort)bVar3 * auVar11._34_2_ | (ushort)!bVar3 * auVar15._34_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x12) & 1);
    auVar12._36_2_ = (ushort)bVar3 * auVar11._36_2_ | (ushort)!bVar3 * auVar15._36_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x13) & 1);
    auVar12._38_2_ = (ushort)bVar3 * auVar11._38_2_ | (ushort)!bVar3 * auVar15._38_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x14) & 1);
    auVar12._40_2_ = (ushort)bVar3 * auVar11._40_2_ | (ushort)!bVar3 * auVar15._40_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x15) & 1);
    auVar12._42_2_ = (ushort)bVar3 * auVar11._42_2_ | (ushort)!bVar3 * auVar15._42_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x16) & 1);
    auVar12._44_2_ = (ushort)bVar3 * auVar11._44_2_ | (ushort)!bVar3 * auVar15._44_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x17) & 1);
    auVar12._46_2_ = (ushort)bVar3 * auVar11._46_2_ | (ushort)!bVar3 * auVar15._46_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x18) & 1);
    auVar12._48_2_ = (ushort)bVar3 * auVar11._48_2_ | (ushort)!bVar3 * auVar15._48_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x19) & 1);
    auVar12._50_2_ = (ushort)bVar3 * auVar11._50_2_ | (ushort)!bVar3 * auVar15._50_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1a) & 1);
    auVar12._52_2_ = (ushort)bVar3 * auVar11._52_2_ | (ushort)!bVar3 * auVar15._52_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1b) & 1);
    auVar12._54_2_ = (ushort)bVar3 * auVar11._54_2_ | (ushort)!bVar3 * auVar15._54_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1c) & 1);
    auVar12._56_2_ = (ushort)bVar3 * auVar11._56_2_ | (ushort)!bVar3 * auVar15._56_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1d) & 1);
    auVar12._58_2_ = (ushort)bVar3 * auVar11._58_2_ | (ushort)!bVar3 * auVar15._58_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1e) & 1);
    auVar12._60_2_ = (ushort)bVar3 * auVar11._60_2_ | (ushort)!bVar3 * auVar15._60_2_;
    bVar3 = SUB81(uVar7 >> 0x1f,0);
    auVar12._62_2_ = (ushort)bVar3 * auVar11._62_2_ | (ushort)!bVar3 * auVar15._62_2_;
    auVar11 = vpunpckhwd_avx512bw(auVar9,auVar12);
    auVar9 = vpunpcklwd_avx512bw(auVar9,auVar12);
    auVar12 = vmovdqa64_avx512f(kernels::upcast16to32(long_long(int))::permutation_indices);
    auVar10 = vpermq_avx512f(auVar12,auVar10);
    auVar12 = vmovdqa64_avx512f(kernels::upcast16to32(long_long(int))::vzero);
    uVar7 = vpcmpgtw_avx512bw(auVar12,auVar10);
    auVar13 = vmovdqu16_avx512bw(kernels::upcast16to32(long_long(int))::vmax_negative);
    bVar3 = (bool)((byte)uVar7 & 1);
    auVar14._0_2_ = (ushort)bVar3 * auVar13._0_2_ | (ushort)!bVar3 * auVar12._0_2_;
    bVar3 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar14._2_2_ = (ushort)bVar3 * auVar13._2_2_ | (ushort)!bVar3 * auVar12._2_2_;
    bVar3 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar14._4_2_ = (ushort)bVar3 * auVar13._4_2_ | (ushort)!bVar3 * auVar12._4_2_;
    bVar3 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar14._6_2_ = (ushort)bVar3 * auVar13._6_2_ | (ushort)!bVar3 * auVar12._6_2_;
    bVar3 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar14._8_2_ = (ushort)bVar3 * auVar13._8_2_ | (ushort)!bVar3 * auVar12._8_2_;
    bVar3 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar14._10_2_ = (ushort)bVar3 * auVar13._10_2_ | (ushort)!bVar3 * auVar12._10_2_;
    bVar3 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar14._12_2_ = (ushort)bVar3 * auVar13._12_2_ | (ushort)!bVar3 * auVar12._12_2_;
    bVar3 = (bool)((byte)(uVar7 >> 7) & 1);
    auVar14._14_2_ = (ushort)bVar3 * auVar13._14_2_ | (ushort)!bVar3 * auVar12._14_2_;
    bVar3 = (bool)((byte)(uVar7 >> 8) & 1);
    auVar14._16_2_ = (ushort)bVar3 * auVar13._16_2_ | (ushort)!bVar3 * auVar12._16_2_;
    bVar3 = (bool)((byte)(uVar7 >> 9) & 1);
    auVar14._18_2_ = (ushort)bVar3 * auVar13._18_2_ | (ushort)!bVar3 * auVar12._18_2_;
    bVar3 = (bool)((byte)(uVar7 >> 10) & 1);
    auVar14._20_2_ = (ushort)bVar3 * auVar13._20_2_ | (ushort)!bVar3 * auVar12._20_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xb) & 1);
    auVar14._22_2_ = (ushort)bVar3 * auVar13._22_2_ | (ushort)!bVar3 * auVar12._22_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xc) & 1);
    auVar14._24_2_ = (ushort)bVar3 * auVar13._24_2_ | (ushort)!bVar3 * auVar12._24_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xd) & 1);
    auVar14._26_2_ = (ushort)bVar3 * auVar13._26_2_ | (ushort)!bVar3 * auVar12._26_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xe) & 1);
    auVar14._28_2_ = (ushort)bVar3 * auVar13._28_2_ | (ushort)!bVar3 * auVar12._28_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0xf) & 1);
    auVar14._30_2_ = (ushort)bVar3 * auVar13._30_2_ | (ushort)!bVar3 * auVar12._30_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x10) & 1);
    auVar14._32_2_ = (ushort)bVar3 * auVar13._32_2_ | (ushort)!bVar3 * auVar12._32_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x11) & 1);
    auVar14._34_2_ = (ushort)bVar3 * auVar13._34_2_ | (ushort)!bVar3 * auVar12._34_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x12) & 1);
    auVar14._36_2_ = (ushort)bVar3 * auVar13._36_2_ | (ushort)!bVar3 * auVar12._36_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x13) & 1);
    auVar14._38_2_ = (ushort)bVar3 * auVar13._38_2_ | (ushort)!bVar3 * auVar12._38_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x14) & 1);
    auVar14._40_2_ = (ushort)bVar3 * auVar13._40_2_ | (ushort)!bVar3 * auVar12._40_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x15) & 1);
    auVar14._42_2_ = (ushort)bVar3 * auVar13._42_2_ | (ushort)!bVar3 * auVar12._42_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x16) & 1);
    auVar14._44_2_ = (ushort)bVar3 * auVar13._44_2_ | (ushort)!bVar3 * auVar12._44_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x17) & 1);
    auVar14._46_2_ = (ushort)bVar3 * auVar13._46_2_ | (ushort)!bVar3 * auVar12._46_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x18) & 1);
    auVar14._48_2_ = (ushort)bVar3 * auVar13._48_2_ | (ushort)!bVar3 * auVar12._48_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x19) & 1);
    auVar14._50_2_ = (ushort)bVar3 * auVar13._50_2_ | (ushort)!bVar3 * auVar12._50_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1a) & 1);
    auVar14._52_2_ = (ushort)bVar3 * auVar13._52_2_ | (ushort)!bVar3 * auVar12._52_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1b) & 1);
    auVar14._54_2_ = (ushort)bVar3 * auVar13._54_2_ | (ushort)!bVar3 * auVar12._54_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1c) & 1);
    auVar14._56_2_ = (ushort)bVar3 * auVar13._56_2_ | (ushort)!bVar3 * auVar12._56_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1d) & 1);
    auVar14._58_2_ = (ushort)bVar3 * auVar13._58_2_ | (ushort)!bVar3 * auVar12._58_2_;
    bVar3 = (bool)((byte)(uVar7 >> 0x1e) & 1);
    auVar14._60_2_ = (ushort)bVar3 * auVar13._60_2_ | (ushort)!bVar3 * auVar12._60_2_;
    bVar3 = SUB81(uVar7 >> 0x1f,0);
    auVar14._62_2_ = (ushort)bVar3 * auVar13._62_2_ | (ushort)!bVar3 * auVar12._62_2_;
    auVar12 = vpunpcklwd_avx512bw(auVar10,auVar14);
    auVar10 = vpunpckhwd_avx512bw(auVar10,auVar14);
    auVar9 = vmovdqa64_avx512f(auVar9);
    *(undefined1 (*) [64])local_2a8.mem_ = auVar9;
    auVar9 = vmovdqa64_avx512f(auVar11);
    *(undefined1 (*) [64])((long)local_2a8.mem_ + 0x40) = auVar9;
    auVar9 = vmovdqa64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)local_2a8.mem_ + 0x80) = auVar9;
    auVar9 = vmovdqa64_avx512f(auVar10);
    *(undefined1 (*) [64])((long)local_2a8.mem_ + 0xc0) = auVar9;
    if (local_2a8.size_ != 0) {
      lVar8 = 0;
      auVar9._56_8_ = 0;
      auVar9._0_56_ = local_288._8_56_;
      local_288 = auVar9 << 0x40;
      do {
        local_178._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_178.m_isBinaryExpression = true;
        local_178.m_result = false;
        local_178._10_6_ = 0;
        local_248.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
        ;
        local_248.line = 0x65;
        Catch::StringRef::StringRef(&local_148,"output[i] == int32_t(input[i])");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_178,&local_248,local_148,ContinueOnFailure);
        cVar1 = local_298.mem_[local_288._0_8_];
        iVar2 = *(int *)((undefined1 *)local_2a8.mem_ + lVar8);
        local_238._0_8_ = lVar8;
        puVar5 = (undefined1 *)local_2a8.mem_;
        local_2ac = (int)cVar1;
        Catch::StringRef::StringRef((StringRef *)&local_248,"==");
        local_178.m_result = iVar2 == cVar1;
        local_178.m_isBinaryExpression = true;
        local_178._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001ed958;
        local_160 = local_248.file;
        sStack_158 = local_248.line;
        local_150 = &local_2ac;
        local_168 = puVar5 + lVar8;
        Catch::AssertionHandler::handleExpr(&local_78,&local_178);
        Catch::ITransientExpression::~ITransientExpression(&local_178);
        Catch::AssertionHandler::complete(&local_78);
        uVar6 = local_238._0_8_;
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        uVar7 = local_288._0_8_ + 1;
        lVar8 = uVar6 + 4;
        local_288._0_8_ = uVar7;
      } while (uVar7 < local_2a8.size_);
    }
    free(local_2a8.mem_);
    free(local_298.mem_);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}